

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
TransitionObservationIndependentMADPDiscrete::SampleSuccessorState
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          TransitionObservationIndependentMADPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *aIs)

{
  MultiAgentDecisionProcessDiscrete *pMVar1;
  uint uVar2;
  size_type __n;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  allocator_type local_31;
  
  __n = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,__n,&local_31);
  uVar4 = 0;
  while( true ) {
    uVar3 = (**(code **)(*(long *)&this->super_MultiAgentDecisionProcess + 0x10))(this);
    uVar5 = (ulong)uVar4;
    if (uVar3 <= uVar5) break;
    pMVar1 = (this->_m_individualMADPDs).
             super__Vector_base<MultiAgentDecisionProcessDiscrete_*,_std::allocator<MultiAgentDecisionProcessDiscrete_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar5];
    uVar2 = (**(code **)(*(long *)&pMVar1->super_MultiAgentDecisionProcess + 0x138))
                      (pMVar1,(sIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                              ._M_impl.super__Vector_impl_data._M_start[uVar5],
                       (aIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar5]);
    (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar5] = uVar2;
    uVar4 = uVar4 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Index> SampleSuccessorState(const std::vector<Index> &sIs,
                                             const std::vector<Index> &aIs)
        const
        {
            std::vector<Index> sucSIs(GetNrAgents());
            for(Index agI = 0; agI < GetNrAgents(); agI++)
                sucSIs[agI]=GetIndividualMADPD(agI)->SampleSuccessorState(sIs[agI],
                                                                          aIs[agI]);
            return(sucSIs);
        }